

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void PIT_CeilingRaise(AActor *thing,FChangePosition *cpos)

{
  sector_t_conflict *psVar1;
  FChangePosition *this;
  uint uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  AActor *local_40;
  AActor *onmobj;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag4,_unsigned_int> local_2c;
  double local_28;
  double oldz;
  FChangePosition *pFStack_18;
  bool isgood;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  pFStack_18 = cpos;
  cpos_local = (FChangePosition *)thing;
  oldz._7_1_ = P_AdjustFloorCeil(thing,cpos);
  local_28 = AActor::Z((AActor *)cpos_local);
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_2c,
             (int)cpos_local + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
            );
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
  if (uVar2 == 0) {
    dVar4 = AActor::Z((AActor *)cpos_local);
    bVar3 = false;
    if (dVar4 < cpos_local[0xd].moveamt) {
      dVar4 = AActor::Top((AActor *)cpos_local);
      bVar3 = false;
      if (*(double *)&cpos_local[0xd].crushchange - pFStack_18->moveamt <= dVar4) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_30,
                   (int)cpos_local +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
        bVar3 = uVar2 == 0;
      }
    }
    if (bVar3) {
      AActor::SetZ((AActor *)cpos_local,cpos_local[0xd].moveamt,true);
      dVar4 = AActor::Top((AActor *)cpos_local);
      if (*(double *)&cpos_local[0xd].crushchange <= dVar4 &&
          dVar4 != *(double *)&cpos_local[0xd].crushchange) {
        AActor::SetZ((AActor *)cpos_local,
                     *(double *)&cpos_local[0xd].crushchange - (double)cpos_local[0x10].sector,true)
        ;
      }
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
    else {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                ((TFlags<ActorFlag2,_unsigned_int> *)((long)&onmobj + 4),
                 (int)cpos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&onmobj + 4));
      bVar3 = false;
      if ((uVar2 != 0) && (bVar3 = false, (oldz._7_1_ & 1) == 0)) {
        dVar4 = AActor::Top((AActor *)cpos_local);
        bVar3 = dVar4 < *(double *)&cpos_local[0xd].crushchange;
      }
      if ((bVar3) && (bVar3 = P_TestMobjZ((AActor *)cpos_local,true,&local_40), !bVar3)) {
        dVar4 = AActor::Z(local_40);
        dVar5 = AActor::Z((AActor *)cpos_local);
        this = cpos_local;
        if (dVar4 <= dVar5) {
          dVar4 = *(double *)&cpos_local[0xd].crushchange;
          psVar1 = cpos_local[0x10].sector;
          dVar5 = AActor::Top(local_40);
          dVar4 = MIN<double>(dVar4 - (double)psVar1,dVar5);
          AActor::SetZ((AActor *)this,dVar4,true);
          AActor::UpdateRenderSectorList((AActor *)cpos_local);
        }
      }
    }
    if ((cpos_local[0x17].moveamt != 0.0) &&
       (*(FChangePosition **)cpos_local[0x17].moveamt == cpos_local)) {
      dVar4 = AActor::Z((AActor *)cpos_local);
      *(double *)((long)cpos_local[0x17].moveamt + 0x60) =
           (dVar4 - local_28) + *(double *)((long)cpos_local[0x17].moveamt + 0x60);
    }
  }
  return;
}

Assistant:

void PIT_CeilingRaise(AActor *thing, FChangePosition *cpos)
{
	bool isgood = P_AdjustFloorCeil(thing, cpos);
	double oldz = thing->Z();

	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	// For DOOM compatibility, only move things that are inside the floor.
	// (or something else?) Things marked as hanging from the ceiling will
	// stay where they are.
	if (thing->Z() < thing->floorz &&
		thing->Top() >= thing->ceilingz - cpos->moveamt &&
		!(thing->flags & MF_NOLIFTDROP))
	{
		thing->SetZ(thing->floorz);
		if (thing->Top() > thing->ceilingz)
		{
			thing->SetZ(thing->ceilingz - thing->Height);
		}
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
	}
	else if ((thing->flags2 & MF2_PASSMOBJ) && !isgood && thing->Top() < thing->ceilingz)
	{
		AActor *onmobj;
		if (!P_TestMobjZ(thing, true, &onmobj) && onmobj->Z() <= thing->Z())
		{
			thing->SetZ(MIN(thing->ceilingz - thing->Height, onmobj->Top()));
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}